

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# largebuddyrange.h
# Opt level: O0

bool snmalloc::
     BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>
     ::can_consolidate(Contents k,size_t size)

{
  bool bVar1;
  Contents t2;
  unsigned_long p;
  MetaEntryBase *this;
  size_t in_RSI;
  Contents in_RDI;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry;
  unsigned_long larger;
  
  t2 = buddy(in_RDI,in_RSI);
  p = bits::max<unsigned_long>(in_RDI,t2);
  this = (MetaEntryBase *)
         FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
         ::get_mut<false>(&BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                           ::concretePagemap,p);
  bVar1 = MetaEntryBase::is_boundary(this);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

static bool can_consolidate(Contents k, size_t size)
    {
      // Need to know both entries exist in the pagemap.
      // This must only be called if that has already been
      // ascertained.
      // The buddy could be in a part of the pagemap that has
      // not been registered and thus could segfault on access.
      auto larger = bits::max(k, buddy(k, size));
      auto& entry =
        Pagemap::template get_metaentry_mut<false>(address_cast(larger));
      return !entry.is_boundary();
    }